

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_buffer.cpp
# Opt level: O3

BmsWord __thiscall BmsBuffer::Get(BmsBuffer *this,barindex pos)

{
  long lVar1;
  mapped_type *pmVar2;
  long lVar3;
  int in_EDX;
  undefined4 in_register_00000034;
  long lVar4;
  key_type local_c;
  
  lVar4 = CONCAT44(in_register_00000034,pos);
  lVar1 = *(long *)(lVar4 + 0x18);
  if (lVar1 != 0) {
    lVar3 = lVar4 + 0x10;
    do {
      if (in_EDX <= *(int *)(lVar1 + 0x20)) {
        lVar3 = lVar1;
      }
      lVar1 = *(long *)(lVar1 + 0x10 + (ulong)(*(int *)(lVar1 + 0x20) < in_EDX) * 8);
    } while (lVar1 != 0);
    if ((lVar3 != lVar4 + 0x10) && (*(int *)(lVar3 + 0x20) <= in_EDX)) {
      pmVar2 = std::
               map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>::
               at((map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>
                   *)(lVar4 + 8),&local_c);
      *(int *)&this->_vptr_BmsBuffer = pmVar2->value_;
      goto LAB_0012a586;
    }
  }
  BmsWord::BmsWord((BmsWord *)this,0);
LAB_0012a586:
  return (BmsWord)(int)this;
}

Assistant:

BmsWord
BmsBuffer::Get(barindex pos) const
{
	if (array_.find(pos) == array_.end()) return 0;
	else return array_.at(pos);
}